

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O0

int __thiscall
Centaurus::LookaheadDFA<unsigned_char>::get_color_num(LookaheadDFA<unsigned_char> *this)

{
  bool bVar1;
  int iVar2;
  vector<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
  *this_00;
  reference this_01;
  vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  *this_02;
  int *piVar3;
  int local_5c;
  NFATransition<unsigned_char> *local_58;
  NFATransition<unsigned_char> *tr;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  *__range3;
  LDFAState<unsigned_char> *state;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
  *__range2;
  LookaheadDFA<unsigned_char> *pLStack_10;
  int max_color_index;
  LookaheadDFA<unsigned_char> *this_local;
  
  __range2._4_4_ = 0;
  this_00 = &(this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states;
  pLStack_10 = this;
  __end0 = std::
           vector<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
           ::begin(this_00);
  state = (LDFAState<unsigned_char> *)
          std::
          vector<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
          ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_Centaurus::LDFAState<unsigned_char>_*,_std::vector<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>_>
                                *)&state);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_Centaurus::LDFAState<unsigned_char>_*,_std::vector<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>_>
              ::operator*(&__end0);
    this_02 = LDFAState<unsigned_char>::get_transitions(this_01);
    __end0_1 = std::
               vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
               ::begin(this_02);
    tr = (NFATransition<unsigned_char> *)
         std::
         vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
         ::end(this_02);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end0_1,
                         (__normal_iterator<const_Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
                          *)&tr);
      if (!bVar1) break;
      local_58 = __gnu_cxx::
                 __normal_iterator<const_Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
                 ::operator*(&__end0_1);
      iVar2 = NFATransition<unsigned_char>::dest(local_58);
      if (iVar2 < 0) {
        local_5c = NFATransition<unsigned_char>::dest(local_58);
        local_5c = -local_5c;
        piVar3 = std::max<int>((int *)((long)&__range2 + 4),&local_5c);
        __range2._4_4_ = *piVar3;
      }
      __gnu_cxx::
      __normal_iterator<const_Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
      ::operator++(&__end0_1);
    }
    __gnu_cxx::
    __normal_iterator<const_Centaurus::LDFAState<unsigned_char>_*,_std::vector<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>_>
    ::operator++(&__end0);
  }
  return __range2._4_4_;
}

Assistant:

int get_color_num() const
	{
		int max_color_index = 0;

		for (const auto& state : m_states)
		{
			for (const auto& tr : state.get_transitions())
			{
				if (tr.dest() < 0)
				{
					max_color_index = std::max(max_color_index, -tr.dest());
				}
			}
		}
		return max_color_index;
	}